

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

void restore_workers_after_fpmt
               (AV1_PRIMARY *ppi,int parallel_frame_count,int num_fpmt_workers_prepared)

{
  long lVar1;
  int iVar2;
  int in_EDX;
  long in_RDI;
  int idx;
  int plane;
  int num_planes;
  AV1_COMMON *cm;
  MultiThreadInfo *mt_info;
  AV1_COMP *cur_cpi;
  int i;
  int frame_idx;
  PrimaryMultiThreadInfo *p_mt_info;
  undefined4 local_40;
  undefined4 local_20;
  undefined4 local_1c;
  
  local_1c = 0;
  for (local_20 = 0; local_20 < in_EDX; local_20 = *(int *)(lVar1 + 0x9ae48) + local_20) {
    lVar1 = *(long *)(in_RDI + (long)local_1c * 8);
    iVar2 = av1_num_planes((AV1_COMMON *)(lVar1 + 0x3bf80));
    if (*(long *)(in_RDI + 0x12418) != 0) {
      *(undefined8 *)(*(long *)(lVar1 + 0x9d1b0) + 0x28) = *(undefined8 *)(lVar1 + 0x9d1b8);
      for (local_40 = 0; local_40 < iVar2; local_40 = local_40 + 1) {
        *(undefined8 *)(*(long *)(lVar1 + 0x9d1b0) + 0x10 + (long)local_40 * 8) =
             *(undefined8 *)(lVar1 + 0x9d1c0 + (long)local_40 * 8);
      }
    }
    iVar2 = is_restoration_used((AV1_COMMON *)(lVar1 + 0x3bf80));
    if (iVar2 != 0) {
      iVar2 = local_20 + *(int *)(lVar1 + 0x9ae48) + -1;
      *(undefined8 *)(*(long *)(lVar1 + 0x9b0f8) + (long)iVar2 * 0x1c0) =
           *(undefined8 *)(lVar1 + 0x9d1d8);
      *(undefined8 *)(*(long *)(lVar1 + 0x9b0f8) + (long)iVar2 * 0x1c0 + 8) =
           *(undefined8 *)(lVar1 + 0x9d1e0);
    }
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

static inline void restore_workers_after_fpmt(AV1_PRIMARY *ppi,
                                              int parallel_frame_count,
                                              int num_fpmt_workers_prepared) {
  assert(parallel_frame_count <= ppi->num_fp_contexts &&
         parallel_frame_count > 1);
  (void)parallel_frame_count;

  PrimaryMultiThreadInfo *const p_mt_info = &ppi->p_mt_info;

  int frame_idx = 0;
  int i = 0;
  while (i < num_fpmt_workers_prepared) {
    AV1_COMP *cur_cpi = ppi->parallel_cpi[frame_idx];
    MultiThreadInfo *mt_info = &cur_cpi->mt_info;
    const AV1_COMMON *const cm = &cur_cpi->common;
    const int num_planes = av1_num_planes(cm);

    // Restore the original cdef_worker pointers.
    if (p_mt_info->cdef_worker != NULL) {
      mt_info->cdef_worker->srcbuf = mt_info->restore_state_buf.cdef_srcbuf;
      for (int plane = 0; plane < num_planes; plane++)
        mt_info->cdef_worker->colbuf[plane] =
            mt_info->restore_state_buf.cdef_colbuf[plane];
    }
#if !CONFIG_REALTIME_ONLY
    if (is_restoration_used(cm)) {
      // Restore the original LR buffers.
      int idx = i + mt_info->num_workers - 1;
      assert(idx < mt_info->lr_row_sync.num_workers);
      mt_info->lr_row_sync.lrworkerdata[idx].rst_tmpbuf =
          mt_info->restore_state_buf.rst_tmpbuf;
      mt_info->lr_row_sync.lrworkerdata[idx].rlbs =
          mt_info->restore_state_buf.rlbs;
    }
#endif

    frame_idx++;
    i += mt_info->num_workers;
  }
}